

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmOutputConverter.cxx
# Opt level: O0

string * __thiscall
cmOutputConverter::ConvertToOutputForExistingCommon
          (string *__return_storage_ptr__,cmOutputConverter *this,string *remote,string *result,
          OutputFormat format)

{
  bool bVar1;
  cmState *this_00;
  long lVar2;
  char *filename;
  undefined1 local_50 [8];
  string tmp;
  OutputFormat format_local;
  string *result_local;
  string *remote_local;
  cmOutputConverter *this_local;
  
  tmp.field_2._12_4_ = format;
  this_00 = GetState(this);
  bVar1 = cmState::UseWindowsShell(this_00);
  if ((bVar1) && (lVar2 = std::__cxx11::string::find((char)result,0x20), lVar2 != -1)) {
    filename = (char *)std::__cxx11::string::c_str();
    bVar1 = cmsys::SystemTools::FileExists(filename);
    if (bVar1) {
      std::__cxx11::string::string((string *)local_50);
      bVar1 = cmsys::SystemTools::GetShortPath(remote,(string *)local_50);
      if (bVar1) {
        ConvertToOutputFormat(__return_storage_ptr__,this,(string *)local_50,tmp.field_2._12_4_);
      }
      std::__cxx11::string::~string((string *)local_50);
      if (bVar1) {
        return __return_storage_ptr__;
      }
    }
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)result);
  return __return_storage_ptr__;
}

Assistant:

std::string
cmOutputConverter::ConvertToOutputForExistingCommon(const std::string& remote,
                                                    std::string const& result,
                                                    OutputFormat format) const
{
  // If this is a windows shell, the result has a space, and the path
  // already exists, we can use a short-path to reference it without a
  // space.
  if(this->GetState()->UseWindowsShell() && result.find(' ') != result.npos &&
     cmSystemTools::FileExists(remote.c_str()))
    {
    std::string tmp;
    if(cmSystemTools::GetShortPath(remote, tmp))
      {
      return this->ConvertToOutputFormat(tmp, format);
      }
    }

  // Otherwise, leave it unchanged.
  return result;
}